

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O1

int __thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
::remove(Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
         *this,char *__filename)

{
  int iVar1;
  undefined8 in_RAX;
  undefined4 extraout_var;
  Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
  *pNVar3;
  long in_RDX;
  char *__filename_00;
  long lVar4;
  bool bVar5;
  bool bVar6;
  Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
  *pNVar2;
  
  iVar1 = (int)CONCAT71((int7)((ulong)in_RAX >> 8),*(char *)(in_RDX + 8));
  if (*(char *)(in_RDX + 8) < (this->_value).second) {
    pNVar2 = (Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
              *)0x0;
  }
  else {
    bVar6 = __filename == (char *)0xffffffffffffffff;
    if (bVar6) {
      pNVar2 = (Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                *)0x0;
    }
    else {
      lVar4 = (long)__filename << 4;
      __filename_00 = __filename;
      do {
        pNVar2 = *(Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                   **)((long)&((this->_nodeRefs)._nodes.
                               super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->pNode + lVar4);
        if (pNVar2 != (Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                       *)0x0) {
          iVar1 = remove(pNVar2,__filename_00);
          pNVar2 = (Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                    *)CONCAT44(extraout_var,iVar1);
          if (pNVar2 != (Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                         *)0x0) {
            pNVar3 = _adjRemoveRefs(this,(size_t)__filename_00,pNVar2);
            goto LAB_01a3159a;
          }
        }
        lVar4 = lVar4 + -0x10;
        pNVar3 = (Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                  *)(__filename_00 + -1);
        bVar6 = pNVar3 == (Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                           *)0xffffffffffffffff;
        bVar5 = __filename_00 != (char *)0x0;
        __filename_00 = __filename_00 + -1;
      } while (bVar5);
      pNVar2 = (Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                *)0x0;
LAB_01a3159a:
      iVar1 = (int)pNVar3;
    }
    if (!bVar6) {
      return iVar1;
    }
  }
  iVar1 = 0;
  if ((__filename == (char *)0x0) &&
     (pNVar2 == (Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                 *)0x0)) {
    if ((this->_value).second == *(char *)(in_RDX + 8)) {
      (this->_nodeRefs)._swapLevel = 0;
      iVar1 = (int)this;
    }
    else {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

Node<T, _Compare> *Node<T, _Compare>::remove(size_t call_level,
                         const T &value) {
    assert(_nodeRefs.height());
    assert(_nodeRefs.noNodePointerMatches(this));

    Node<T, _Compare> *pNode = nullptr;
    // Effectively: if (value >= _value) {
    if (!_compare(value, _value)) {
        for (size_t level = call_level + 1; level-- > 0;) {
            if (_nodeRefs[level].pNode) {
                // Make progress to the right
                pNode = _nodeRefs[level].pNode->remove(level, value);
                if (pNode) {
                    return _adjRemoveRefs(level, pNode);
                }
            }
            // Make progress down
        }
    }
    if (! pNode) { // Base case
        // We only admit to being the node to remove if the caller is
        // approaching us from level 0. It is entirely likely that
        // the same (or an other) caller can see us at a higher level
        // but the recursion stack will not have been set up in the correct
        // step wise fashion so that the lower level references will
        // not be swapped.
        // Effectively: if (call_level == 0 && value == _value) {
        if (call_level == 0 && !_compare(value, _value) && !_compare(_value, value)) {
            _nodeRefs.resetSwapLevel();
            return this;
        }
    }
    assert(pNode == nullptr);
    return nullptr;
}